

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

ostream * despot::operator<<(ostream *os,
                            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *vec)

{
  ulong uVar1;
  size_type sVar2;
  ostream *os_00;
  reference __x;
  char *pcVar3;
  vector<double,_std::allocator<double>_> local_38;
  int local_1c;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *pvStack_18;
  int i;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *vec_local;
  ostream *os_local;
  
  pvStack_18 = vec;
  vec_local = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)os;
  std::operator<<(os,"[");
  local_1c = 0;
  while( true ) {
    uVar1 = (ulong)local_1c;
    sVar2 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(vec);
    if (sVar2 <= uVar1) break;
    pcVar3 = ", ";
    if (local_1c == 0) {
      pcVar3 = "";
    }
    os_00 = std::operator<<((ostream *)vec_local,pcVar3);
    __x = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::operator[](vec,(long)local_1c);
    std::vector<double,_std::allocator<double>_>::vector(&local_38,__x);
    operator<<(os_00,&local_38);
    std::vector<double,_std::allocator<double>_>::~vector(&local_38);
    local_1c = local_1c + 1;
  }
  std::operator<<((ostream *)vec_local,"]");
  return (ostream *)vec_local;
}

Assistant:

std::ostream& operator<<(std::ostream& os, std::vector<T> vec) {
	os << "[";
	for (int i = 0; i < vec.size(); i++)
		os << (i == 0 ? "" : ", ") << vec[i];
	os << "]";
	return os;
}